

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O1

offset_t __thiscall ImportedFuncWrapper::getFieldRVA(ImportedFuncWrapper *this,FieldID fId)

{
  Executable *pEVar1;
  ExeNodeWrapper *pEVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  bool bVar6;
  bool isOk;
  char local_21;
  
  local_21 = (char)((ulong)in_RAX >> 0x38);
  if ((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode ==
      (ExeNodeWrapper *)0x0) {
    return 0;
  }
  pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  if (pEVar1 == (Executable *)0x0) {
    bVar6 = false;
  }
  else {
    iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
    bVar6 = iVar3 == 0x20;
  }
  pEVar2 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode;
  iVar3 = (*(pEVar2->super_ExeElementWrapper).super_AbstractByteBuffer._vptr_AbstractByteBuffer
            [0x1c])(pEVar2,(long)fId,0xffffffffffffffff,&local_21);
  if (local_21 == '\x01') {
    lVar5 = (long)iVar3;
    if (!bVar6) {
      lVar5 = CONCAT44(extraout_var,iVar3);
    }
    if (1 < lVar5 + 1U) {
      pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      if (pEVar1 == (Executable *)0x0) {
        lVar4 = 4;
      }
      else {
        iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
        lVar4 = (ulong)(iVar3 == 0x40) * 4 + 4;
      }
      return lVar4 * (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                     entryNum + lVar5;
    }
  }
  return 0;
}

Assistant:

offset_t ImportedFuncWrapper::getFieldRVA(ImportEntryWrapper::FieldID fId)
{
    if (!parentNode) return 0;
    bool is32 = isBit32();

    bool isOk;
    uint64_t thunkRva = parentNode->getNumValue(fId, &isOk);
    if (!isOk) return 0; //TODO

    if (is32) thunkRva = (int32_t)(thunkRva);
    if (thunkRva == 0 ||  thunkRva == (-1)) return 0; //TODO

    size_t thunkValSize = this->getThunkValSize();
    offset_t offset = this->entryNum * thunkValSize;

    offset_t fieldRVA = thunkRva + offset;
    return fieldRVA;
}